

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadAnimation(ColladaParser *this,Animation *pParent)

{
  iterator iVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer ppVar8;
  undefined4 extraout_var_04;
  Animation *pAVar9;
  vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  *this_00;
  pointer ppVar10;
  mapped_type *ppAVar11;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_AnimationChannel>_>::value,_pair<iterator,_bool>_>
  _Var12;
  iterator local_338;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
  local_330;
  iterator local_328;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
  local_320;
  const_iterator it;
  string local_310;
  _Self local_2f0;
  allocator local_2e1;
  key_type local_2e0;
  _Self local_2c0;
  iterator cit;
  char *sourceId;
  int indexSource;
  int indexTarget;
  AnimationChannel local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>
  local_1d0;
  _Base_ptr local_f0;
  undefined1 local_e8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
  local_e0;
  iterator newChannel;
  undefined1 local_d0 [8];
  string id;
  int indexID_1;
  int indexID;
  undefined1 local_90 [4];
  int indexName;
  string animID;
  string animName;
  Animation *anim;
  ChannelMap channels;
  Animation *pParent_local;
  ColladaParser *this_local;
  
  channels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pParent;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar4 & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
           *)&anim);
    animName.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)(animID.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_90);
    uVar4 = TestAttribute(this,"name");
    uVar5 = TestAttribute(this,"id");
    if (-1 < (int)uVar5) {
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
      std::__cxx11::string::operator=((string *)local_90,(char *)CONCAT44(extraout_var,iVar6));
    }
    if ((int)uVar4 < 0) {
      if ((int)uVar5 < 0) {
        std::__cxx11::string::operator=((string *)(animID.field_2._M_local_buf + 8),"animation");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(animID.field_2._M_local_buf + 8),(string *)local_90);
      }
    }
    else {
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
      std::__cxx11::string::operator=
                ((string *)(animID.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar6)
                );
    }
    do {
      while( true ) {
        uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar4 & 1) == 0) goto LAB_0060d7da;
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar6 != 1) break;
        bVar3 = IsElement(this,"animation");
        if (bVar3) {
          if (animName.field_2._8_8_ == 0) {
            pAVar9 = (Animation *)operator_new(0x50);
            Collada::Animation::Animation(pAVar9);
            animName.field_2._8_8_ = pAVar9;
            std::__cxx11::string::operator=
                      ((string *)pAVar9,(string *)(animID.field_2._M_local_buf + 8));
            std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ::push_back((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                         *)(channels._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38),
                        (value_type *)((long)&animName.field_2 + 8));
          }
          ReadAnimation(this,(Animation *)animName.field_2._8_8_);
        }
        else {
          bVar3 = IsElement(this,"source");
          if (bVar3) {
            ReadSource(this);
          }
          else {
            bVar3 = IsElement(this,"sampler");
            if (bVar3) {
              id.field_2._12_4_ = GetAttribute(this,"id");
              iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                (this->mReader,(ulong)(uint)id.field_2._12_4_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_d0,(char *)CONCAT44(extraout_var_01,iVar6),
                         (allocator *)((long)&newChannel._M_node + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&newChannel._M_node + 7));
              local_298.mInterpolationValues.field_2._M_allocated_capacity = 0;
              local_298.mInterpolationValues.field_2._8_8_ = 0;
              local_298.mInterpolationValues._M_dataplus = (_Alloc_hider)0x0;
              local_298.mInterpolationValues._1_7_ = 0;
              local_298.mInterpolationValues._M_string_length = 0;
              local_298.mOutTanValues.field_2._M_allocated_capacity = 0;
              local_298.mOutTanValues.field_2._8_8_ = 0;
              local_298.mOutTanValues._M_dataplus = (_Alloc_hider)0x0;
              local_298.mOutTanValues._1_7_ = 0;
              local_298.mOutTanValues._M_string_length = 0;
              local_298.mInTanValues.field_2._M_allocated_capacity = 0;
              local_298.mInTanValues.field_2._8_8_ = 0;
              local_298.mInTanValues._M_dataplus = (_Alloc_hider)0x0;
              local_298.mInTanValues._1_7_ = 0;
              local_298.mInTanValues._M_string_length = 0;
              local_298.mSourceValues.field_2._M_allocated_capacity = 0;
              local_298.mSourceValues.field_2._8_8_ = 0;
              local_298.mSourceValues._M_dataplus = (_Alloc_hider)0x0;
              local_298.mSourceValues._1_7_ = 0;
              local_298.mSourceValues._M_string_length = 0;
              local_298.mSourceTimes.field_2._M_allocated_capacity = 0;
              local_298.mSourceTimes.field_2._8_8_ = 0;
              local_298.mSourceTimes._M_dataplus = (_Alloc_hider)0x0;
              local_298.mSourceTimes._1_7_ = 0;
              local_298.mSourceTimes._M_string_length = 0;
              local_298.mTarget.field_2._M_allocated_capacity = 0;
              local_298.mTarget.field_2._8_8_ = 0;
              local_298.mTarget._M_dataplus = (_Alloc_hider)0x0;
              local_298.mTarget._1_7_ = 0;
              local_298.mTarget._M_string_length = 0;
              Collada::AnimationChannel::AnimationChannel(&local_298);
              std::make_pair<std::__cxx11::string&,Assimp::Collada::AnimationChannel>
                        (&local_1d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0,&local_298);
              _Var12 = std::
                       map<std::__cxx11::string,Assimp::Collada::AnimationChannel,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>>
                       ::insert<std::pair<std::__cxx11::string,Assimp::Collada::AnimationChannel>>
                                 ((map<std::__cxx11::string,Assimp::Collada::AnimationChannel,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>>
                                   *)&anim,&local_1d0);
              local_f0 = (_Base_ptr)_Var12.first._M_node;
              local_e8 = _Var12.second;
              local_e0._M_node = local_f0;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>
              ::~pair(&local_1d0);
              Collada::AnimationChannel::~AnimationChannel(&local_298);
              ppVar8 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
                       ::operator->(&local_e0);
              ReadAnimationSampler(this,&ppVar8->second);
              std::__cxx11::string::~string((string *)local_d0);
            }
            else {
              bVar3 = IsElement(this,"channel");
              if (bVar3) {
                uVar4 = GetAttribute(this,"target");
                uVar7 = GetAttribute(this,"source");
                iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar7);
                cit._M_node = (_Base_ptr)CONCAT44(extraout_var_02,iVar6);
                if ((char)(cit._M_node)->_M_color == 0x23) {
                  cit._M_node = (_Base_ptr)((long)&(cit._M_node)->_M_color + 1);
                }
                iVar1._M_node = cit._M_node;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2e0,(char *)iVar1._M_node,&local_2e1);
                local_2c0._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                             *)&anim,&local_2e0);
                std::__cxx11::string::~string((string *)&local_2e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
                local_2f0._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                            *)&anim);
                bVar3 = std::operator!=(&local_2c0,&local_2f0);
                if (bVar3) {
                  iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
                  ppVar8 = std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
                           ::operator->(&local_2c0);
                  std::__cxx11::string::operator=
                            ((string *)&ppVar8->second,(char *)CONCAT44(extraout_var_03,iVar6));
                }
                uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
                if ((uVar4 & 1) == 0) {
                  SkipElement(this);
                }
              }
              else {
                SkipElement(this);
              }
            }
          }
        }
      }
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar6 != 2);
    iVar6 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar6 = strcmp((char *)CONCAT44(extraout_var_04,iVar6),"animation");
    if (iVar6 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_310,"Expected end of <animation> element.",
                 (allocator *)((long)&it._M_node + 7));
      ThrowException(this,&local_310);
    }
LAB_0060d7da:
    bVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                     *)&anim);
    if (!bVar3) {
      if (animName.field_2._8_8_ == 0) {
        pAVar9 = (Animation *)operator_new(0x50);
        Collada::Animation::Animation(pAVar9);
        animName.field_2._8_8_ = pAVar9;
        std::__cxx11::string::operator=
                  ((string *)pAVar9,(string *)(animID.field_2._M_local_buf + 8));
        std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
        push_back((vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                   *)(channels._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x38),
                  (value_type *)((long)&animName.field_2 + 8));
      }
      local_328._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                    *)&anim);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
      ::_Rb_tree_const_iterator(&local_320,&local_328);
      while( true ) {
        local_338._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                    *)&anim);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
        ::_Rb_tree_const_iterator(&local_330,&local_338);
        bVar3 = std::operator!=(&local_320,&local_330);
        uVar2 = animName.field_2._8_8_;
        if (!bVar3) break;
        this_00 = (vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                   *)(animName.field_2._8_8_ + 0x20);
        ppVar10 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
                  ::operator->(&local_320);
        std::
        vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
        ::push_back(this_00,&ppVar10->second);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>
        ::operator++(&local_320);
      }
      if (-1 < (int)uVar5) {
        ppAVar11 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*>_>_>
                   ::operator[](&this->mAnimationLibrary,(key_type *)local_90);
        *ppAVar11 = (mapped_type)uVar2;
      }
    }
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)(animID.field_2._M_local_buf + 8));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
            *)&anim);
  }
  return;
}

Assistant:

void ColladaParser::ReadAnimation(Collada::Animation* pParent)
{
    if (mReader->isEmptyElement())
        return;

    // an <animation> element may be a container for grouping sub-elements or an animation channel
    // this is the channel collection by ID, in case it has channels
    typedef std::map<std::string, AnimationChannel> ChannelMap;
    ChannelMap channels;
    // this is the anim container in case we're a container
    Animation* anim = NULL;

    // optional name given as an attribute
    std::string animName;
    std::string animID;
    int indexName = TestAttribute("name");
    int indexID = TestAttribute("id");

    if (indexID >= 0)
        animID = mReader->getAttributeValue(indexID);

    if (indexName >= 0)
        animName = mReader->getAttributeValue(indexName);
    else if (indexID >= 0)
        animName = animID;
    else
        animName = "animation";

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // we have subanimations
            if (IsElement("animation"))
            {
                // create container from our element
                if (!anim)
                {
                    anim = new Animation;
                    anim->mName = animName;
                    pParent->mSubAnims.push_back(anim);
                }

                // recurse into the subelement
                ReadAnimation(anim);
            }
            else if (IsElement("source"))
            {
                // possible animation data - we'll never know. Better store it
                ReadSource();
            }
            else if (IsElement("sampler"))
            {
                // read the ID to assign the corresponding collada channel afterwards.
                int indexID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(indexID);
                ChannelMap::iterator newChannel = channels.insert(std::make_pair(id, AnimationChannel())).first;

                // have it read into a channel
                ReadAnimationSampler(newChannel->second);
            }
            else if (IsElement("channel"))
            {
                // the binding element whose whole purpose is to provide the target to animate
                // Thanks, Collada! A directly posted information would have been too simple, I guess.
                // Better add another indirection to that! Can't have enough of those.
                int indexTarget = GetAttribute("target");
                int indexSource = GetAttribute("source");
                const char* sourceId = mReader->getAttributeValue(indexSource);
                if (sourceId[0] == '#')
                    sourceId++;
                ChannelMap::iterator cit = channels.find(sourceId);
                if (cit != channels.end())
                    cit->second.mTarget = mReader->getAttributeValue(indexTarget);

                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "animation") != 0)
                ThrowException("Expected end of <animation> element.");

            break;
        }
    }

    // it turned out to have channels - add them
    if (!channels.empty())
    {
        // FIXME: Is this essentially doing the same as "single-anim-node" codepath in
        //        ColladaLoader::StoreAnimations? For now, this has been deferred to after
        //        all animations and all clips have been read. Due to handling of
        //        <library_animation_clips> this cannot be done here, as the channel owner
        //        is lost, and some exporters make up animations by referring to multiple
        //        single-channel animations from an <instance_animation>.
/*
        // special filtering for stupid exporters packing each channel into a separate animation
        if( channels.size() == 1)
        {
            pParent->mChannels.push_back( channels.begin()->second);
        } else
*/
        {
            // else create the animation, if not done yet, and store the channels
            if (!anim)
            {
                anim = new Animation;
                anim->mName = animName;
                pParent->mSubAnims.push_back(anim);
            }
            for (ChannelMap::const_iterator it = channels.begin(); it != channels.end(); ++it)
                anim->mChannels.push_back(it->second);

            if (indexID >= 0)
            {
                mAnimationLibrary[animID] = anim;
            }
        }
    }
}